

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptDate * __thiscall Js::JavascriptLibrary::CreateDate(JavascriptLibrary *this)

{
  code *pcVar1;
  bool bVar2;
  DynamicType **ppDVar3;
  undefined4 *puVar4;
  Recycler *pRVar5;
  JavascriptDate *this_00;
  TrackAllocData local_38;
  JavascriptLibrary *local_10;
  JavascriptLibrary *this_local;
  
  local_10 = this;
  ppDVar3 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                      ((WriteBarrierPtr *)&this->dateType);
  if (*ppDVar3 == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x17fa,"(dateType)","Where\'s dateType?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pRVar5 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_38,(type_info *)&JavascriptDate::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x17fb);
  pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_38);
  this_00 = (JavascriptDate *)new<Memory::Recycler>(0x80,pRVar5,0x43c4b0);
  ppDVar3 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                      ((WriteBarrierPtr *)&this->dateType);
  JavascriptDate::JavascriptDate(this_00,0.0,*ppDVar3);
  return this_00;
}

Assistant:

JavascriptDate* JavascriptLibrary::CreateDate()
    {
        AssertMsg(dateType, "Where's dateType?");
        return RecyclerNew(this->GetRecycler(), JavascriptDate, 0, dateType);
    }